

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

GenerateBlockSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::GenerateBlockSyntax,slang::syntax::GenerateBlockSyntax_const&>
          (BumpAllocator *this,GenerateBlockSyntax *args)

{
  GenerateBlockSyntax *pGVar1;
  GenerateBlockSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pGVar1 = (GenerateBlockSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::GenerateBlockSyntax::GenerateBlockSyntax(in_RSI,pGVar1);
  return pGVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }